

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomNormalDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomnormaldynamic(NeuralNetworkLayer *this)

{
  bool bVar1;
  RandomNormalDynamicLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_randomnormaldynamic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randomnormaldynamic(this);
    this_00 = (RandomNormalDynamicLayerParams *)operator_new(0x28);
    RandomNormalDynamicLayerParams::RandomNormalDynamicLayerParams(this_00);
    (this->layer_).randomnormaldynamic_ = this_00;
  }
  return (RandomNormalDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalDynamicLayerParams* NeuralNetworkLayer::mutable_randomnormaldynamic() {
  if (!has_randomnormaldynamic()) {
    clear_layer();
    set_has_randomnormaldynamic();
    layer_.randomnormaldynamic_ = new ::CoreML::Specification::RandomNormalDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomNormalDynamic)
  return layer_.randomnormaldynamic_;
}